

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O0

int wally_confidential_addr_from_addr
              (char *address,uint32_t prefix,uchar *pub_key,size_t pub_key_len,char **output)

{
  int local_8c;
  size_t sStack_88;
  int ret;
  size_t written;
  uchar *addr_bytes_p;
  uchar buf [59];
  char **output_local;
  size_t pub_key_len_local;
  uchar *pub_key_local;
  uint32_t prefix_local;
  char *address_local;
  
  written = (size_t)(buf + 0x1a);
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  if ((((address == (char *)0x0) || ((prefix & 0xffffff00) != 0)) || (pub_key == (uchar *)0x0)) ||
     ((pub_key_len != 0x21 || (output == (char **)0x0)))) {
    address_local._4_4_ = -2;
  }
  else {
    unique0x100000c7 = output;
    local_8c = wally_base58_to_bytes(address,1,(uchar *)written,0x19,&stack0xffffffffffffff78);
    if (local_8c == 0) {
      if (sStack_88 == 0x15) {
        addr_bytes_p._0_1_ = (undefined1)prefix;
        addr_bytes_p._1_1_ = *(undefined1 *)written;
        memcpy((void *)((long)&addr_bytes_p + 2),pub_key,0x21);
        local_8c = wally_base58_from_bytes((uchar *)&addr_bytes_p,0x37,1,stack0xffffffffffffffc8);
      }
      else {
        local_8c = -2;
      }
    }
    wally_clear(&addr_bytes_p,0x3b);
    address_local._4_4_ = local_8c;
  }
  return address_local._4_4_;
}

Assistant:

int wally_confidential_addr_from_addr(
    const char *address,
    uint32_t prefix,
    const unsigned char *pub_key,
    size_t pub_key_len,
    char **output)
{
    unsigned char buf[2 + EC_PUBLIC_KEY_LEN + HASH160_LEN + BASE58_CHECKSUM_LEN];
    unsigned char *addr_bytes_p = &buf[EC_PUBLIC_KEY_LEN + 1];
    size_t written;
    int ret;

    if (output)
        *output = NULL;

    if (!address || (prefix & 0xffffff00) || !pub_key || pub_key_len != EC_PUBLIC_KEY_LEN || !output)
        return WALLY_EINVAL;

    /* Decode the passed address */
    ret = wally_base58_to_bytes(address, BASE58_FLAG_CHECKSUM,
                                addr_bytes_p, 1 + HASH160_LEN + BASE58_CHECKSUM_LEN, &written);
    if (ret == WALLY_OK) {
        if (written != HASH160_LEN + 1)
            ret = WALLY_EINVAL;
        else {
            /* Copy the prefix/version/pubkey and encode the address to return */
            buf[0] = prefix & 0xff;
            buf[1] = addr_bytes_p[0];
            memcpy(buf + 2, pub_key, pub_key_len);
            ret = wally_base58_from_bytes(buf, sizeof(buf) - BASE58_CHECKSUM_LEN,
                                          BASE58_FLAG_CHECKSUM, output);
        }
    }

    wally_clear(buf, sizeof(buf));
    return ret;
}